

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPScheduler::AnalyseIncoming(RTCPScheduler *this,RTCPCompoundPacket *rtcpcomppack)

{
  size_t sVar1;
  bool bVar2;
  PacketType PVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_t packsize_1;
  size_t packsize;
  RTCPPacket *p;
  bool isbye;
  RTCPCompoundPacket *rtcpcomppack_local;
  RTCPScheduler *this_local;
  
  bVar2 = false;
  RTCPCompoundPacket::GotoFirstPacket(rtcpcomppack);
  while( true ) {
    bVar7 = false;
    if (!bVar2) {
      packsize = (size_t)RTCPCompoundPacket::GetNextPacket(rtcpcomppack);
      bVar7 = (RTCPPacket *)packsize != (RTCPPacket *)0x0;
    }
    if (!bVar7) break;
    PVar3 = RTCPPacket::GetPacketType((RTCPPacket *)packsize);
    if (PVar3 == BYE) {
      bVar2 = true;
    }
  }
  if (bVar2) {
    if ((this->byescheduled & 1U) != 0) {
      sVar1 = this->headeroverhead;
      sVar4 = RTCPCompoundPacket::GetCompoundPacketLength(rtcpcomppack);
      lVar5 = sVar1 + sVar4;
      auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar10._0_8_ = lVar5;
      auVar10._12_4_ = 0x45300000;
      sVar1 = this->avgbyepacketsize;
      auVar12._8_4_ = (int)(sVar1 >> 0x20);
      auVar12._0_8_ = sVar1;
      auVar12._12_4_ = 0x45300000;
      dVar8 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 0.0625 +
              ((auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 0.9375;
      uVar6 = (ulong)dVar8;
      this->avgbyepacketsize = uVar6 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f;
      this->byemembers = this->byemembers + 1;
    }
  }
  else {
    sVar1 = this->headeroverhead;
    sVar4 = RTCPCompoundPacket::GetCompoundPacketLength(rtcpcomppack);
    lVar5 = sVar1 + sVar4;
    auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = 0x45300000;
    sVar1 = this->avgrtcppacksize;
    auVar11._8_4_ = (int)(sVar1 >> 0x20);
    auVar11._0_8_ = sVar1;
    auVar11._12_4_ = 0x45300000;
    dVar8 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 0.0625 +
            ((auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 0.9375;
    uVar6 = (ulong)dVar8;
    this->avgrtcppacksize = uVar6 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f;
  }
  return;
}

Assistant:

void RTCPScheduler::AnalyseIncoming(RTCPCompoundPacket &rtcpcomppack)
{
	bool isbye = false;
	RTCPPacket *p;
	
	rtcpcomppack.GotoFirstPacket();
	while (!isbye && ((p = rtcpcomppack.GetNextPacket()) != 0))
	{
		if (p->GetPacketType() == RTCPPacket::BYE)
			isbye = true;
	}
	
	if (!isbye)
	{
		size_t packsize = headeroverhead+rtcpcomppack.GetCompoundPacketLength();
		avgrtcppacksize = (size_t)((1.0/16.0)*((double)packsize)+(15.0/16.0)*((double)avgrtcppacksize));
	}
	else
	{
		if (byescheduled)
		{
			size_t packsize = headeroverhead+rtcpcomppack.GetCompoundPacketLength();
			avgbyepacketsize = (size_t)((1.0/16.0)*((double)packsize)+(15.0/16.0)*((double)avgbyepacketsize));
			byemembers++;
		}
	}
}